

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O2

ssize_t __thiscall
blcl::net::connection<MsgType>::send
          (connection<MsgType> *this,int __fd,void *__buf,size_t __n,int __flags)

{
  io_context *ctx;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  type local_30;
  
  ctx = this->asio_context_;
  local_30.this = this;
  message<MsgType>::message(&local_30.msg,(message<MsgType> *)CONCAT44(in_register_00000034,__fd));
  asio::
  post<asio::io_context,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Swung0x48[P]SimpleRealTimeNetworking_NetCommon_net_connection_h:82:17)>
            (ctx,&local_30,0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_30.msg.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return extraout_RAX;
}

Assistant:

void send(const message<T>& msg) {
            asio::post(asio_context_,
                [this, msg]() {
                    bool writing_message = !outgoing_messages_.empty();
                    outgoing_messages_.push_back(msg);
                    if (!writing_message)
                        write_header();
            });
        }